

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O1

string * __thiscall
deqp::gls::ShaderExecUtil::ComputeShaderExecutor::generateComputeShader_abi_cxx11_
          (string *__return_storage_ptr__,ComputeShaderExecutor *this,ShaderSpec *spec)

{
  pointer ppSVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  ostringstream src;
  undefined1 auStack_198 [8];
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  __s = glu::getGLSLVersionDeclaration
                  (*(GLSLVersion *)
                    &(this->super_BufferIoExecutor).super_ShaderExecutor._vptr_ShaderExecutor);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_198 + (long)*(_func_int **)(local_190._0_8_ + -0x18)) + 8);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  ppSVar1 = (this->super_BufferIoExecutor).m_program.m_shaders[0].
            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_190,
                        (char *)(this->super_BufferIoExecutor).super_ShaderExecutor.m_outputs.
                                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)ppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"layout(local_size_x = 1) in;\n",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"\n",1);
  BufferIoExecutor::declareBufferBlocks((ostream *)local_190,(ShaderSpec *)this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"void main (void)\n",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\tuint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n",0x4d)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\t                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n",0x4e
            );
  BufferIoExecutor::generateExecBufferIo((ostream *)local_190,(ShaderSpec *)this,"invocationNdx");
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string ComputeShaderExecutor::generateComputeShader (const ShaderSpec& spec)
{
	std::ostringstream src;

	src << glu::getGLSLVersionDeclaration(spec.version) << "\n";

	if (!spec.globalDeclarations.empty())
		src << spec.globalDeclarations << "\n";

	src << "layout(local_size_x = 1) in;\n"
		<< "\n";

	declareBufferBlocks(src, spec);

	src << "void main (void)\n"
		<< "{\n"
		<< "	uint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n"
		<< "	                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n";

	generateExecBufferIo(src, spec, "invocationNdx");

	src << "}\n";

	return src.str();
}